

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Production.cpp
# Opt level: O1

void __thiscall
SGParser::Generator::ParseTableProduction::PrintLookAhead
          (ParseTableProduction *this,String *str,
          map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
          *pgrammarSymbolsInv)

{
  bool bVar1;
  mapped_type *ppbVar2;
  _Base_ptr p_Var3;
  _Rb_tree_color _Var4;
  _Rb_tree_header *p_Var5;
  size_type *local_80;
  String dest;
  String local_58;
  _Rb_tree_color local_34 [2];
  uint iTerminal;
  
  local_80 = &dest._M_string_length;
  dest._M_dataplus._M_p = (pointer)0x0;
  dest._M_string_length._0_1_ = 0;
  p_Var3 = (this->LookAhead)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(this->LookAhead)._M_t._M_impl.super__Rb_tree_header;
  dest.field_2._8_8_ = str;
  if ((_Rb_tree_header *)p_Var3 != p_Var5) {
    bVar1 = false;
    do {
      local_34[0] = p_Var3[1]._M_color;
      if (bVar1) {
        std::__cxx11::string::append((char *)&local_80);
      }
      _Var4 = local_34[0] & 0xfffffff;
      if (pgrammarSymbolsInv ==
          (map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
           *)0x0) {
        if (_Var4 == _S_black) goto LAB_0013cd05;
        if (_Var4 < 0x22) {
          StringWithFormat<char>(&local_58,"x%02X");
          std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_58._M_dataplus._M_p);
        }
        else {
          StringWithFormat<char>(&local_58,"%c",(ulong)(uint)(int)(char)((char)local_34[0] + -2));
          std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_58._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
      }
      else if (_Var4 == _S_black) {
LAB_0013cd05:
        std::__cxx11::string::append((char *)&local_80);
      }
      else {
        ppbVar2 = std::
                  map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                  ::operator[](pgrammarSymbolsInv,local_34);
        std::__cxx11::string::_M_append((char *)&local_80,(ulong)((*ppbVar2)->_M_dataplus)._M_p);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      bVar1 = true;
    } while ((_Rb_tree_header *)p_Var3 != p_Var5);
  }
  std::__cxx11::string::swap((string *)dest.field_2._8_8_);
  if (local_80 != &dest._M_string_length) {
    operator_delete(local_80,CONCAT71(dest._M_string_length._1_7_,(undefined1)dest._M_string_length)
                             + 1);
  }
  return;
}

Assistant:

void ParseTableProduction::PrintLookAhead(String& str,
                                   std::map<unsigned, const String*>* pgrammarSymbolsInv) const {
    String dest;
    bool   flag = false;

    for (const auto iTerminal : LookAhead) {
        if (flag)
            dest += " ";
        flag = true;

        const auto terminal = iTerminal & ProductionMask::TerminalValue;

        if (pgrammarSymbolsInv) {
            if (terminal == TokenCode::TokenEOF)
                dest += "EOF";
            else
                dest += *(*pgrammarSymbolsInv)[iTerminal];
        } else {
            if (terminal == TokenCode::TokenEOF)
                dest += "EOF";
            else if (terminal < 32u + TokenCode::TokenFirstID)
                dest += StringWithFormat("x%02X", terminal);
            else
                dest += StringWithFormat("%c", char(terminal - TokenCode::TokenFirstID));
        }
    }

    str.swap(dest);
}